

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png_io.cc
# Opt level: O1

void __thiscall
gimage::PNGImageIO::load
          (PNGImageIO *this,ImageU16 *image,char *name,int ds,long x,long y,long w,long h)

{
  int *piVar1;
  long lVar2;
  unsigned_short ***pppuVar3;
  size_t __n;
  byte bVar4;
  byte bVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  FILE *__stream;
  __jmp_buf_tag *__env;
  void *pvVar9;
  ulong uVar10;
  size_type *psVar11;
  IOException *pIVar12;
  long *plVar13;
  uint uVar14;
  void *pvVar15;
  long lVar16;
  ushort uVar17;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  void *pvVar22;
  ulong uVar23;
  long lVar24;
  int iVar25;
  png_infop info;
  png_infop end;
  long local_180;
  int local_174;
  long local_170;
  ulong local_168;
  ulong local_160;
  ulong local_158;
  allocator local_149;
  string local_148;
  long local_128;
  long local_120;
  ulong local_118;
  ulong local_110;
  uint local_108;
  uint local_104;
  uint local_100;
  int local_fc;
  long local_f8;
  ulong local_f0;
  void *local_e8;
  void *local_e0;
  void *local_d8;
  void *local_d0;
  void *local_c8;
  ImageU16 *local_c0;
  long local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  ulong local_70;
  void *local_68;
  long local_60;
  void *local_58;
  long local_50;
  ulong local_48;
  size_t local_40;
  FILE *local_38;
  
  local_174 = ds;
  local_128 = x;
  local_120 = y;
  iVar6 = (*(this->super_BasicImageIO)._vptr_BasicImageIO[3])(this,name,1);
  if ((char)iVar6 == '\0') {
    pIVar12 = (IOException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)&local_b0,name,(allocator *)&local_180);
    std::operator+(&local_90,"Can only load PNG image (",&local_b0);
    plVar13 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_148._M_dataplus._M_p = (pointer)*plVar13;
    psVar11 = (size_type *)(plVar13 + 2);
    if ((size_type *)local_148._M_dataplus._M_p == psVar11) {
      local_148.field_2._M_allocated_capacity = *psVar11;
      local_148.field_2._8_8_ = plVar13[3];
      local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
    }
    else {
      local_148.field_2._M_allocated_capacity = *psVar11;
    }
    local_148._M_string_length = plVar13[1];
    *plVar13 = (long)psVar11;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    gutil::IOException::IOException(pIVar12,&local_148);
    __cxa_throw(pIVar12,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  __stream = fopen(name,"rb");
  if (__stream == (FILE *)0x0) {
    pIVar12 = (IOException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)&local_b0,name,(allocator *)&local_180);
    std::operator+(&local_90,"Cannot open file (",&local_b0);
    plVar13 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_148._M_dataplus._M_p = (pointer)*plVar13;
    psVar11 = (size_type *)(plVar13 + 2);
    if ((size_type *)local_148._M_dataplus._M_p == psVar11) {
      local_148.field_2._M_allocated_capacity = *psVar11;
      local_148.field_2._8_8_ = plVar13[3];
      local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
    }
    else {
      local_148.field_2._M_allocated_capacity = *psVar11;
    }
    local_148._M_string_length = plVar13[1];
    *plVar13 = (long)psVar11;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    gutil::IOException::IOException(pIVar12,&local_148);
    __cxa_throw(pIVar12,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  local_180 = png_create_read_struct("1.6.37",0,0);
  if (local_180 == 0) {
    fclose(__stream);
    pIVar12 = (IOException *)__cxa_allocate_exception(0x28);
    local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_148,"Cannot allocate handle for reading PNG files","");
    gutil::IOException::IOException(pIVar12,&local_148);
    __cxa_throw(pIVar12,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  local_170 = png_create_info_struct(local_180);
  if (local_170 == 0) {
    png_destroy_read_struct(&local_180,0);
    fclose(__stream);
    pIVar12 = (IOException *)__cxa_allocate_exception(0x28);
    local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_148,"Cannot allocate PNG info structure","");
    gutil::IOException::IOException(pIVar12,&local_148);
    __cxa_throw(pIVar12,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  local_b8 = png_create_info_struct(local_180);
  if (local_b8 == 0) {
    png_destroy_read_struct(&local_180,&local_170,0);
    fclose(__stream);
    pIVar12 = (IOException *)__cxa_allocate_exception(0x28);
    local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_148,"Cannot allocate PNG info structure","");
    gutil::IOException::IOException(pIVar12,&local_148);
    __cxa_throw(pIVar12,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  __env = (__jmp_buf_tag *)png_set_longjmp_fn(local_180,longjmp,200);
  iVar6 = _setjmp(__env);
  if (iVar6 != 0) {
    png_destroy_read_struct(&local_180,&local_170,&local_b8);
    fclose(__stream);
    pIVar12 = (IOException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)&local_b0,name,&local_149);
    std::operator+(&local_90,"Cannot read PNG file (",&local_b0);
    plVar13 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_148._M_dataplus._M_p = (pointer)*plVar13;
    psVar11 = (size_type *)(plVar13 + 2);
    if ((size_type *)local_148._M_dataplus._M_p == psVar11) {
      local_148.field_2._M_allocated_capacity = *psVar11;
      local_148.field_2._8_8_ = plVar13[3];
      local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
    }
    else {
      local_148.field_2._M_allocated_capacity = *psVar11;
    }
    local_148._M_string_length = plVar13[1];
    *plVar13 = (long)psVar11;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    gutil::IOException::IOException(pIVar12,&local_148);
    __cxa_throw(pIVar12,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  local_38 = __stream;
  png_init_io(local_180,__stream);
  png_read_info(local_180,local_170);
  uVar7 = png_get_image_width(local_180,local_170);
  uVar8 = png_get_image_height(local_180,local_170);
  bVar4 = png_get_color_type(local_180,local_170);
  uVar14 = 1;
  if ((byte)(bVar4 - 2) < 5) {
    uVar14 = *(uint *)(&DAT_00164db0 + (ulong)(byte)(bVar4 - 2) * 4);
  }
  if (w < 0) {
    w = (long)((ulong)uVar7 + (long)local_174 + -1) / (long)local_174;
  }
  local_160 = (ulong)uVar8;
  if (h < 0) {
    h = (long)((long)local_174 + local_160 + -1) / (long)local_174;
  }
  uVar23 = (ulong)uVar14;
  local_168 = w;
  local_158 = (ulong)uVar7;
  local_110 = h;
  local_100 = uVar14;
  Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::setSize(image,w,h,uVar23);
  lVar19 = image->n;
  lVar16 = -lVar19;
  if (0 < lVar19) {
    lVar16 = lVar19;
  }
  memset(image->pixel,0,lVar16 * 2);
  if (bVar4 == 3) {
    png_set_palette_to_rgb(local_180);
  }
  bVar5 = png_get_bit_depth(local_180,local_170);
  if (bVar5 < 8 && bVar4 == 0) {
    png_set_expand_gray_1_2_4_to_8(local_180);
  }
  if ((bVar4 & 4) != 0) {
    png_set_strip_alpha(local_180);
  }
  iVar6 = png_get_rowbytes(local_180,local_170);
  uVar10 = local_160;
  uVar21 = 0xffffffffffffffff;
  if (-1 < (long)((long)iVar6 * local_160)) {
    uVar21 = (long)iVar6 * local_160;
  }
  local_c8 = operator_new__(uVar21);
  pvVar9 = operator_new__(uVar10 * 8);
  if (uVar10 != 0) {
    uVar21 = 0;
    pvVar15 = local_c8;
    do {
      *(void **)((long)pvVar9 + uVar21 * 8) = pvVar15;
      uVar21 = uVar21 + 1;
      pvVar15 = (void *)((long)pvVar15 + (long)iVar6);
    } while (uVar10 != uVar21);
  }
  png_read_image(local_180);
  uVar10 = local_168;
  if ((((local_174 < 2) && (local_120 == 0 && local_128 == 0)) && (local_168 == local_158)) &&
     (local_110 == local_160)) {
    if (local_160 != 0) {
      pppuVar3 = image->img;
      uVar23 = 0;
      do {
        if ((int)local_158 != 0) {
          uVar21 = 0;
          uVar10 = uVar21;
          do {
            uVar18 = 0;
            uVar20 = uVar10;
            do {
              iVar6 = (int)uVar20;
              if (bVar5 < 0x10) {
                uVar17 = (ushort)*(byte *)(*(long *)((long)pvVar9 + uVar23 * 8) + (long)iVar6);
                iVar25 = 1;
              }
              else {
                uVar17 = *(ushort *)(*(long *)((long)pvVar9 + uVar23 * 8) + (long)iVar6);
                uVar17 = uVar17 << 8 | uVar17 >> 8;
                iVar25 = 2;
              }
              uVar10 = (ulong)(uint)(iVar6 + iVar25);
              pppuVar3[uVar18][uVar23][uVar21] = uVar17;
              uVar18 = uVar18 + 1;
              uVar20 = (ulong)(uint)(iVar6 + iVar25);
            } while (uVar14 != uVar18);
            uVar21 = uVar21 + 1;
          } while (uVar21 != local_158);
        }
        uVar23 = uVar23 + 1;
      } while (uVar23 != local_160);
    }
  }
  else {
    uVar21 = local_168 * uVar23 * 4;
    pvVar15 = operator_new(uVar21);
    local_d8 = pvVar15;
    if (uVar10 != 0) {
      memset(pvVar15,0,uVar21);
    }
    local_e8 = operator_new(uVar21);
    local_e0 = local_e8;
    local_d0 = pvVar15;
    if (local_168 != 0) {
      memset(local_e8,0,uVar21);
    }
    uVar10 = 0;
    if (-local_120 != 0 && local_120 < 1) {
      uVar10 = -local_120;
    }
    local_40 = uVar21;
    if ((long)uVar10 < (long)local_110) {
      lVar19 = (long)local_174;
      uVar20 = 0;
      uVar21 = lVar19 * local_120;
      if (lVar19 * local_120 < 1) {
        uVar21 = uVar20;
      }
      local_fc = 0;
      if (0 < local_128) {
        local_fc = (int)local_128;
      }
      local_fc = local_fc * local_100 * local_174;
      local_118 = -local_128;
      if (-local_128 == 0 || 0 < local_128) {
        local_118 = uVar20;
      }
      local_50 = local_118 * uVar23;
      local_58 = (void *)((long)local_e0 + local_50 * 4);
      local_60 = uVar23 * 4;
      local_68 = (void *)((long)local_d8 + local_50 * 4);
      local_c0 = image;
      local_48 = local_118;
      do {
        __n = local_40;
        local_f8 = (local_120 + uVar10) * lVar19;
        local_f0 = uVar10;
        if ((long)local_160 <= local_f8) break;
        uVar14 = (uint)uVar21;
        if (local_168 != 0) {
          local_108 = (uint)uVar21;
          memset(local_d0,0,local_40);
          image = local_c0;
          memset(local_e8,0,__n);
          uVar14 = local_108;
        }
        if ((0 < local_174) && (local_f8 < (long)local_160)) {
          lVar16 = (long)(int)uVar14;
          uVar10 = uVar20;
          do {
            local_70 = uVar10;
            pvVar15 = local_68;
            pvVar22 = local_58;
            uVar10 = local_118;
            iVar6 = local_fc;
            if ((long)local_118 < (long)local_168) {
              do {
                lVar24 = (uVar10 + local_128) * lVar19;
                if ((long)local_158 <= lVar24) break;
                uVar21 = uVar20;
                uVar18 = uVar20;
                if (0 < local_174) {
                  do {
                    if (bVar5 < 0x10) {
                      uVar14 = (uint)*(byte *)(*(long *)((long)pvVar9 + lVar16 * 8) + (long)iVar6);
                      iVar25 = 1;
                    }
                    else {
                      uVar17 = *(ushort *)(*(long *)((long)pvVar9 + lVar16 * 8) + (long)iVar6);
                      uVar14 = (uint)(ushort)(uVar17 << 8 | uVar17 >> 8);
                      iVar25 = 2;
                    }
                    iVar6 = iVar6 + iVar25;
                    piVar1 = (int *)((long)pvVar15 + uVar21 * 4);
                    *piVar1 = *piVar1 + uVar14;
                    piVar1 = (int *)((long)pvVar22 + uVar21 * 4);
                    *piVar1 = *piVar1 + 1;
                    uVar21 = uVar21 + 1;
                  } while ((uVar23 != uVar21) ||
                          (((long)(uVar18 + 1) < lVar19 &&
                           (lVar2 = lVar24 + uVar18, uVar21 = uVar20, uVar18 = uVar18 + 1,
                           lVar2 + 1 < (long)local_158))));
                }
                uVar10 = uVar10 + 1;
                pvVar15 = (void *)((long)pvVar15 + local_60);
                pvVar22 = (void *)((long)pvVar22 + local_60);
              } while (uVar10 != local_168);
            }
            lVar16 = lVar16 + 1;
          } while (((long)(local_70 + 1) < lVar19) &&
                  (uVar10 = local_70 + 1, (long)(local_70 + local_f8 + 1) < (long)local_160));
          uVar14 = (uint)lVar16;
          image = local_c0;
        }
        lVar16 = local_50;
        uVar10 = local_48;
        if ((long)local_118 < (long)local_168) {
          do {
            if ((long)local_158 <= (long)((local_128 + uVar10) * lVar19)) break;
            pppuVar3 = image->img;
            uVar21 = uVar20;
            do {
              uVar7 = *(uint *)((long)local_e0 + uVar21 * 4 + lVar16 * 4);
              if (0 < (int)uVar7) {
                pppuVar3[uVar21][local_f0][uVar10] =
                     (ushort)((int)((uVar7 >> 1) +
                                   *(int *)((long)local_d8 + uVar21 * 4 + lVar16 * 4)) / (int)uVar7)
                     & 0xff;
              }
              uVar21 = uVar21 + 1;
            } while (uVar23 != uVar21);
            uVar10 = uVar10 + 1;
            lVar16 = lVar16 + uVar21;
          } while (uVar10 != local_168);
        }
        uVar10 = local_f0 + 1;
        uVar21 = (ulong)uVar14;
        local_104 = uVar14;
      } while (uVar10 != local_110);
    }
    operator_delete(local_e8);
    operator_delete(local_d0);
  }
  operator_delete__(pvVar9);
  operator_delete__(local_c8);
  png_destroy_read_struct(&local_180,&local_170,&local_b8);
  fclose(local_38);
  return;
}

Assistant:

void PNGImageIO::load(ImageU16 &image, const char *name, int ds, long x, long y,
                      long w, long h) const
{
  if (!handlesFile(name, true))
  {
    throw gutil::IOException("Can only load PNG image ("+std::string(name)+")");
  }

  // initialize reading a png file

  FILE *in=fopen(name, "rb");

  if (in == 0)
  {
    throw gutil::IOException("Cannot open file ("+std::string(name)+")");
  }

  png_structp png=png_create_read_struct(PNG_LIBPNG_VER_STRING, 0, 0, 0);

  if (png == 0)
  {
    fclose(in);
    throw gutil::IOException("Cannot allocate handle for reading PNG files");
  }

  png_infop info=png_create_info_struct(png);

  if (info == 0)
  {
    png_destroy_read_struct(&png, static_cast<png_infopp>(0), static_cast<png_infopp>(0));
    fclose(in);
    throw gutil::IOException("Cannot allocate PNG info structure");
  }

  png_infop end=png_create_info_struct(png);

  if (end == 0)
  {
    png_destroy_read_struct(&png, &info, static_cast<png_infopp>(0));
    fclose(in);
    throw gutil::IOException("Cannot allocate PNG info structure");
  }

  unsigned char *img=0;
  unsigned char **row=0;

  if (setjmp(png_jmpbuf(png)))
  {
    delete [] img;
    delete [] row;

    png_destroy_read_struct(&png, &info, &end);
    fclose(in);
    throw gutil::IOException("Cannot read PNG file ("+std::string(name)+")");
  }

  // read header data

  png_init_io(png, in);
  png_read_info(png, info);

  long width=static_cast<long>(png_get_image_width(png, info));
  long height=static_cast<long>(png_get_image_height(png, info));

  int depth=1;
  int color=png_get_color_type(png, info);

  if (color == PNG_COLOR_TYPE_PALETTE || color == PNG_COLOR_TYPE_RGB ||
      color == PNG_COLOR_TYPE_RGB_ALPHA)
  {
    depth=3;
  }

  // adapt size of image

  if (w < 0)
  {
    w=(width+ds-1)/ds;
  }

  if (h < 0)
  {
    h=(height+ds-1)/ds;
  }

  image.setSize(w, h, depth);
  image.clear();

  // transform palette images to RGB

  if (color == PNG_COLOR_TYPE_PALETTE)
  {
    png_set_palette_to_rgb(png);
  }

  int bits=png_get_bit_depth(png, info);

  if (color == PNG_COLOR_TYPE_GRAY && bits < 8)
  {
    png_set_expand_gray_1_2_4_to_8(png);
  }

  // strip alpha channel if available

  if ((color & PNG_COLOR_MASK_ALPHA) != 0)
  {
    png_set_strip_alpha(png);
  }

  // read image completely

  int rn=static_cast<int>(png_get_rowbytes(png, info));
  img=new unsigned char [height*rn];
  row=new unsigned char * [height];

  for (int k=0; k<height; k++)
  {
    row[k]=img+k*rn;
  }

  png_read_image(png, static_cast<png_bytepp>(row));

  // load downscaled part?

  if (ds > 1 || x != 0 || y != 0 || w != width || h != height)
  {
    std::valarray<ImageU16::work_t> vline(0, w*depth);
    std::valarray<int> nline(0, w*depth);

    // skip the first y*ds image rows

    int rk=std::max(0l, y*ds);

    for (long k=std::max(0l, -y); k<h && (y+k)*ds<height; k++)
    {
      // load downscaled line

      vline=0;
      nline=0;

      for (long kk=0; kk<ds && kk+(y+k)*ds<height; kk++)
      {
        int  jj=std::max(0l, x)*ds*depth;
        long j=std::max(0l, -x)*depth;

        for (long i=std::max(0l, -x); i<w && (x+i)*ds<width; i++)
        {
          for (int ii=0; ii<ds && (x+i)*ds+ii<width; ii++)
          {
            for (int d=0; d<depth; d++)
            {
              ImageU16::store_t v;

              if (bits < 16)
              {
                v=static_cast<ImageU16::store_t>(row[rk][jj]);
                jj++;
              }
              else
              {
                v=static_cast<ImageU16::store_t>(row[rk][jj]<<8) | row[rk][jj+1];
                jj+=2;
              }

              if (image.isValidS(v))
              {
                vline[j+d]+=v;
                nline[j+d]++;
              }
            }
          }

          j+=depth;
        }

        rk++;
      }

      // store line into image

      long j=std::max(0l, -x)*depth;

      for (long i=std::max(0l, -x); i<w && (x+i)*ds<width; i++)
      {
        for (int d=0; d<depth; d++)
        {
          if (nline[j] > 0)
          {
            image.set(i, k, d, static_cast<ImageU8::store_t>((vline[j]+nline[j]/2)/nline[j]));
          }

          j++;
        }
      }
    }
  }
  else // load whole image
  {
    for (long k=0; k<height; k++)
    {
      int j=0;

      for (long i=0; i<width; i++)
      {
        for (int d=0; d<depth; d++)
        {
          ImageU16::store_t v;

          if (bits < 16)
          {
            v=static_cast<ImageU16::store_t>(row[k][j]);
            j++;
          }
          else
          {
            v=static_cast<ImageU16::store_t>(row[k][j]<<8) | row[k][j+1];
            j+=2;
          }

          image.set(i, k, d, v);
        }
      }
    }
  }

  // close data set

  delete [] row;
  delete [] img;

  png_destroy_read_struct(&png, &info, &end);
  fclose(in);
}